

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t in_DL;
  ulong in_RSI;
  long *in_RDI;
  
  if (in_RSI < (ulong)in_RDI[3]) {
    bVar1 = IsFull(in_DL);
    if (bVar1) {
      SanitizerUnpoisonObject<cov::dll*>((dll **)0x5027f4);
    }
    else {
      SanitizerPoisonObject<cov::dll*>((dll **)0x502810);
    }
    *(ctrl_t *)(*in_RDI + in_RSI) = in_DL;
    *(ctrl_t *)(*in_RDI + (in_RSI - 0x10 & in_RDI[3]) + 1 + (in_RDI[3] & 0xfU)) = in_DL;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x9cd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll *>, phmap::priv::HashEq<cov::dll *>::Hash, phmap::priv::HashEq<cov::dll *>::Eq, std::allocator<cov::dll *>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashSetPolicy<cov::dll *>, Hash = phmap::priv::HashEq<cov::dll *>::Hash, Eq = phmap::priv::HashEq<cov::dll *>::Eq, Alloc = std::allocator<cov::dll *>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h)
			{
				assert(i < capacity_);

				if (IsFull(h)) {
					SanitizerUnpoisonObject(slots_ + i);
				}
				else {
					SanitizerPoisonObject(slots_ + i);
				}

				ctrl_[i] = h;
				ctrl_[((i - Group::kWidth) & capacity_) + 1 +
				                           ((Group::kWidth - 1) & capacity_)] = h;
			}